

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLCMAC.cpp
# Opt level: O0

EVP_CIPHER * __thiscall OSSLCMACDES::getEVPCipher(OSSLCMACDES *this)

{
  long lVar1;
  undefined8 uVar2;
  long in_RDI;
  EVP_CIPHER *local_8;
  
  lVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
  if (lVar1 == 0x38) {
    softHSMLog(3,"getEVPCipher",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLCMAC.cpp"
               ,0x29,"Only supporting 3DES");
    local_8 = (EVP_CIPHER *)0x0;
  }
  else if (lVar1 == 0x70) {
    local_8 = EVP_des_ede_cbc();
  }
  else if (lVar1 == 0xa8) {
    local_8 = EVP_des_ede3_cbc();
  }
  else {
    uVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
    softHSMLog(3,"getEVPCipher",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLCMAC.cpp"
               ,0x33,"Invalid DES bit len %i",uVar2);
    local_8 = (EVP_CIPHER *)0x0;
  }
  return (EVP_CIPHER *)local_8;
}

Assistant:

const EVP_CIPHER* OSSLCMACDES::getEVPCipher() const
{
	switch(currentKey->getBitLen())
	{
		case 56:
			ERROR_MSG("Only supporting 3DES");
			return NULL;
		case 112:
			return EVP_des_ede_cbc();
		case 168:
			return EVP_des_ede3_cbc();
		default:
			break;
	};

	ERROR_MSG("Invalid DES bit len %i", currentKey->getBitLen());

	return NULL;
}